

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O2

HPDF_STATUS HPDF_Xref_WriteToStream(HPDF_Xref xref,HPDF_Stream_conflict stream,HPDF_Encrypt e)

{
  ushort gen_no;
  void *pvVar1;
  char *pcVar2;
  HPDF_STATUS HVar3;
  HPDF_BYTE *s;
  HPDF_XrefEntry p_Var4;
  char *pcVar5;
  HPDF_UINT index;
  uint index_00;
  HPDF_Xref p_Var6;
  HPDF_UINT32 object_id;
  char buf [32];
  
  p_Var6 = xref;
  do {
    if (p_Var6 == (HPDF_Xref)0x0) {
      p_Var6 = xref;
      while( true ) {
        if (p_Var6 == (HPDF_Xref)0x0) {
          if (xref == (HPDF_Xref)0x0) {
            HVar3 = 0x1033;
          }
          else {
            HVar3 = HPDF_Dict_AddNumber(xref->trailer,"Size",
                                        xref->start_offset + xref->entries->count);
            if (((HVar3 == 0) &&
                (((xref->prev == (HPDF_Xref)0x0 ||
                  (HVar3 = HPDF_Dict_AddNumber(xref->trailer,"Prev",xref->prev->addr), HVar3 == 0))
                 && (HVar3 = HPDF_Stream_WriteStr(stream,"trailer\n"), HVar3 == 0)))) &&
               (((HVar3 = HPDF_Dict_Write(xref->trailer,stream,(HPDF_Encrypt)0x0), HVar3 == 0 &&
                 (HVar3 = HPDF_Stream_WriteStr(stream,"\nstartxref\n"), HVar3 == 0)) &&
                (HVar3 = HPDF_Stream_WriteUInt(stream,xref->addr), HVar3 == 0)))) {
              HVar3 = HPDF_Stream_WriteStr(stream,"\n%%EOF\n");
            }
          }
          return HVar3;
        }
        p_Var6->addr = stream->size;
        pcVar5 = buf + 0x1f;
        s = HPDF_StrCpy(buf,"xref\n",pcVar5);
        pcVar2 = HPDF_IToA((char *)s,p_Var6->start_offset,pcVar5);
        *pcVar2 = ' ';
        pcVar2 = HPDF_IToA(pcVar2 + 1,p_Var6->entries->count,pcVar5);
        HPDF_StrCpy(pcVar2,"\n",pcVar5);
        HVar3 = HPDF_Stream_WriteStr(stream,buf);
        if (HVar3 != 0) break;
        index_00 = 0;
        while (index_00 < p_Var6->entries->count) {
          p_Var4 = HPDF_Xref_GetEntry(p_Var6,index_00);
          pcVar5 = HPDF_IToA2(buf,p_Var4->byte_offset,0xb);
          *pcVar5 = ' ';
          pcVar5 = HPDF_IToA2(pcVar5 + 1,(uint)p_Var4->gen_no,6);
          *pcVar5 = ' ';
          pcVar5[1] = p_Var4->entry_typ;
          HPDF_StrCpy(pcVar5 + 2,"\r\n",buf + 0x1f);
          HVar3 = HPDF_Stream_WriteStr(stream,buf);
          index_00 = index_00 + 1;
          if (HVar3 != 0) {
            return HVar3;
          }
        }
        p_Var6 = p_Var6->prev;
      }
      return HVar3;
    }
    index = (HPDF_UINT)(p_Var6->start_offset == 0);
    while (index < p_Var6->entries->count) {
      pvVar1 = HPDF_List_ItemAt(p_Var6->entries,index);
      object_id = p_Var6->start_offset + index;
      gen_no = *(ushort *)((long)pvVar1 + 8);
      *(HPDF_UINT *)((long)pvVar1 + 4) = stream->size;
      pcVar5 = buf + 0x1f;
      pcVar2 = HPDF_IToA(buf,object_id,pcVar5);
      *pcVar2 = ' ';
      pcVar2 = HPDF_IToA(pcVar2 + 1,(uint)gen_no,pcVar5);
      HPDF_StrCpy(pcVar2," obj\n",pcVar5);
      HVar3 = HPDF_Stream_WriteStr(stream,buf);
      if (HVar3 != 0) {
        return HVar3;
      }
      if (e != (HPDF_Encrypt)0x0) {
        HPDF_Encrypt_InitKey(e,object_id,gen_no);
      }
      HVar3 = HPDF_Obj_WriteValue(*(void **)((long)pvVar1 + 0x10),stream,e);
      if (HVar3 != 0) {
        return HVar3;
      }
      HVar3 = HPDF_Stream_WriteStr(stream,"\nendobj\n");
      index = index + 1;
      if (HVar3 != 0) {
        return HVar3;
      }
    }
    p_Var6 = p_Var6->prev;
  } while( true );
}

Assistant:

HPDF_STATUS
HPDF_Xref_WriteToStream  (HPDF_Xref    xref,
                          HPDF_Stream  stream,
                          HPDF_Encrypt e)
{
    HPDF_STATUS ret;
    HPDF_UINT i;
    char buf[HPDF_SHORT_BUF_SIZ];
    char* pbuf;
    char* eptr = buf + HPDF_SHORT_BUF_SIZ - 1;
    HPDF_UINT str_idx;
    HPDF_Xref tmp_xref = xref;

    /* write each objects of xref to the specified stream */

    HPDF_PTRACE((" HPDF_Xref_WriteToStream\n"));

    while (tmp_xref) {
        if (tmp_xref->start_offset == 0)
            str_idx = 1;
        else
            str_idx = 0;

        for (i = str_idx; i < tmp_xref->entries->count; i++) {
            HPDF_XrefEntry  entry =
                        (HPDF_XrefEntry)HPDF_List_ItemAt (tmp_xref->entries, i);
            HPDF_UINT obj_id = tmp_xref->start_offset + i;
            HPDF_UINT16 gen_no = entry->gen_no;

            entry->byte_offset = stream->size;

            pbuf = buf;
            pbuf = HPDF_IToA (pbuf, obj_id, eptr);
            *pbuf++ = ' ';
            pbuf = HPDF_IToA (pbuf, gen_no, eptr);
            HPDF_StrCpy(pbuf, " obj\012", eptr);

            if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
               return ret;

            if (e)
                HPDF_Encrypt_InitKey (e, obj_id, gen_no);

            if ((ret = HPDF_Obj_WriteValue (entry->obj, stream, e)) != HPDF_OK)
                return ret;

            if ((ret = HPDF_Stream_WriteStr (stream, "\012endobj\012"))
                    != HPDF_OK)
                return ret;
       }

       tmp_xref = tmp_xref->prev;
    }

    /* start to write cross-reference table */

    tmp_xref = xref;

    while (tmp_xref) {
        tmp_xref->addr = stream->size;

        pbuf = buf;
        pbuf = (char *)HPDF_StrCpy (pbuf, "xref\012", eptr);
        pbuf = HPDF_IToA (pbuf, tmp_xref->start_offset, eptr);
        *pbuf++ = ' ';
        pbuf = HPDF_IToA (pbuf, tmp_xref->entries->count, eptr);
        HPDF_StrCpy (pbuf, "\012", eptr);
        ret = HPDF_Stream_WriteStr (stream, buf);
        if (ret != HPDF_OK)
            return ret;

        for (i = 0; i < tmp_xref->entries->count; i++) {
            HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

            pbuf = buf;
            pbuf = HPDF_IToA2 (pbuf, entry->byte_offset, HPDF_BYTE_OFFSET_LEN +
                    1);
            *pbuf++ = ' ';
            pbuf = HPDF_IToA2 (pbuf, entry->gen_no, HPDF_GEN_NO_LEN + 1);
            *pbuf++ = ' ';
            *pbuf++ = entry->entry_typ;
            HPDF_StrCpy (pbuf, "\015\012", eptr); /* Acrobat 8.15 requires both \r and \n here */
            ret = HPDF_Stream_WriteStr (stream, buf);
            if (ret != HPDF_OK)
                return ret;
        }

        tmp_xref = tmp_xref->prev;
    }

    /* write trailer dictionary */
    ret = WriteTrailer (xref, stream);

    return ret;
}